

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int jmp_list_merge(Parser *psr,int left,int right)

{
  BcIns *pBVar1;
  uint uVar2;
  uint uVar3;
  
  if (right == -1) {
    return left;
  }
  uVar2 = right;
  if (left != -1) {
    do {
      uVar3 = uVar2;
      if (-1 < (int)uVar2) {
        uVar3 = (psr->vm->fns[psr->scope->fn].ins[uVar2] >> 8) + (uVar2 - 0x7fffff);
      }
      do {
        if (uVar3 == 0xffffffff) {
          pBVar1 = psr->vm->fns[psr->scope->fn].ins;
          pBVar1[(int)uVar2] = (left - uVar2) * 0x100 + (uint)(byte)pBVar1[(int)uVar2] + 0x7fffff00;
          return right;
        }
        uVar3 = uVar2;
      } while ((int)uVar2 < 0);
      uVar2 = (uVar2 + (psr->vm->fns[psr->scope->fn].ins[uVar2] >> 8)) - 0x7fffff;
    } while( true );
  }
  return right;
}

Assistant:

static int jmp_list_merge(Parser *psr, int left, int right) {
	// If either jump list is empty, the result is trivial
	if (right == -1) {
		return left;
	} else if (left == -1) {
		return right;
	}

	// Find the last element in `right`
	int last = right;
	while (jmp_follow(psr, last) != -1) {
		last = jmp_follow(psr, last);
	}

	// Point the last element in `right` to `left`
	jmp_set_target(psr, last, left);

	// The head of the merged list must be `right`
	return right;
}